

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall ncnn::Gemm::load_param(Gemm *this,ParamDict *pd)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  fVar3 = ParamDict::get(pd,0,1.0);
  this->alpha = fVar3;
  fVar3 = ParamDict::get(pd,1,1.0);
  this->beta = fVar3;
  iVar2 = ParamDict::get(pd,2,0);
  this->transA = iVar2;
  iVar2 = ParamDict::get(pd,3,0);
  this->transB = iVar2;
  iVar2 = ParamDict::get(pd,4,0);
  this->constantA = iVar2;
  iVar2 = ParamDict::get(pd,5,0);
  this->constantB = iVar2;
  iVar2 = ParamDict::get(pd,6,0);
  this->constantC = iVar2;
  iVar2 = ParamDict::get(pd,7,0);
  this->constantM = iVar2;
  iVar2 = ParamDict::get(pd,8,0);
  this->constantN = iVar2;
  iVar2 = ParamDict::get(pd,9,0);
  this->constantK = iVar2;
  iVar2 = ParamDict::get(pd,10,0);
  this->constant_broadcast_type_C = iVar2;
  iVar2 = ParamDict::get(pd,0xb,0);
  this->output_N1M = iVar2;
  iVar2 = ParamDict::get(pd,0xc,0);
  this->output_elempack = iVar2;
  iVar2 = ParamDict::get(pd,0xd,0);
  this->output_elemtype = iVar2;
  iVar2 = ParamDict::get(pd,0xe,0);
  this->output_transpose = iVar2;
  iVar2 = ParamDict::get(pd,0x14,0);
  this->constant_TILE_M = iVar2;
  iVar2 = ParamDict::get(pd,0x15,0);
  this->constant_TILE_N = iVar2;
  iVar2 = ParamDict::get(pd,0x16,0);
  this->constant_TILE_K = iVar2;
  iVar2 = this->constantA;
  if ((iVar2 == 1) && ((this->constantM == 0 || (this->constantK == 0)))) {
    load_param();
  }
  else {
    iVar1 = this->constantB;
    if ((iVar1 != 1) || ((this->constantN != 0 && (this->constantK != 0)))) {
      if (this->constantC == 1) {
        if (this->constant_broadcast_type_C - 5U < 0xfffffffa) {
          load_param();
          return -1;
        }
        if (iVar1 == 1 && iVar2 == 0) {
          (this->super_Layer).one_blob_only = true;
          return 0;
        }
        if (iVar2 != 1 || iVar1 != 0) {
          return 0;
        }
      }
      else {
        if (iVar2 != 1) {
          return 0;
        }
        if (iVar1 != 1) {
          return 0;
        }
        if (this->constantC != 0) {
          return 0;
        }
      }
      (this->super_Layer).one_blob_only = true;
      return 0;
    }
    load_param();
  }
  return -1;
}

Assistant:

int Gemm::load_param(const ParamDict& pd)
{
    alpha = pd.get(0, 1.f);
    beta = pd.get(1, 1.f);
    transA = pd.get(2, 0);
    transB = pd.get(3, 0);
    constantA = pd.get(4, 0);
    constantB = pd.get(5, 0);
    constantC = pd.get(6, 0);
    constantM = pd.get(7, 0);
    constantN = pd.get(8, 0);
    constantK = pd.get(9, 0);
    constant_broadcast_type_C = pd.get(10, 0);
    output_N1M = pd.get(11, 0);
    output_elempack = pd.get(12, 0);
    output_elemtype = pd.get(13, 0);
    output_transpose = pd.get(14, 0);
    constant_TILE_M = pd.get(20, 0);
    constant_TILE_N = pd.get(21, 0);
    constant_TILE_K = pd.get(22, 0);

    if (constantA == 1 && (constantM == 0 || constantK == 0))
    {
        NCNN_LOGE("constantM and constantK must be non-zero when constantA enabled");
        return -1;
    }

    if (constantB == 1 && (constantN == 0 || constantK == 0))
    {
        NCNN_LOGE("constantN and constantK must be non-zero when constantB enabled");
        return -1;
    }

    if (constantC == 1 && (constant_broadcast_type_C < -1 || constant_broadcast_type_C > 4))
    {
        NCNN_LOGE("constant_broadcast_type_C must be -1 or 0~4 when constantC enabled");
        return -1;
    }

    if (constantA == 0 && constantB == 1 && constantC == 1)
        one_blob_only = true;

    if (constantA == 1 && constantB == 0 && constantC == 1)
        one_blob_only = true;

    if (constantA == 1 && constantB == 1 && constantC == 0)
        one_blob_only = true;

    return 0;
}